

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O0

void __thiscall LinePrinter::PrintOnNewLine(LinePrinter *this,string *to_print)

{
  byte bVar1;
  ulong uVar2;
  char *data;
  size_t size;
  reference pcVar3;
  bool local_31;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  string *local_18;
  string *to_print_local;
  LinePrinter *this_local;
  
  local_18 = to_print;
  to_print_local = (string *)this;
  if ((this->console_locked_ & 1U) != 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((string *)&this->output_buffer_);
      std::__cxx11::string::append((ulong)&this->output_buffer_,'\x01');
      std::__cxx11::string::clear();
    }
  }
  if ((this->have_blank_line_ & 1U) == 0) {
    PrintOrBuffer(this,"\n",1);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    data = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    size = std::__cxx11::string::size();
    PrintOrBuffer(this,data,size);
  }
  bVar1 = std::__cxx11::string::empty();
  local_31 = true;
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::rbegin();
    pcVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_20);
    local_31 = *pcVar3 == '\n';
  }
  this->have_blank_line_ = local_31;
  return;
}

Assistant:

void LinePrinter::PrintOnNewLine(const string& to_print) {
  if (console_locked_ && !line_buffer_.empty()) {
    output_buffer_.append(line_buffer_);
    output_buffer_.append(1, '\n');
    line_buffer_.clear();
  }
  if (!have_blank_line_) {
    PrintOrBuffer("\n", 1);
  }
  if (!to_print.empty()) {
    PrintOrBuffer(&to_print[0], to_print.size());
  }
  have_blank_line_ = to_print.empty() || *to_print.rbegin() == '\n';
}